

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O1

void __thiscall rsg::ValueStorage<1>::ValueStorage(ValueStorage<1> *this,VariableType *type)

{
  int iVar1;
  
  (this->m_value).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_value).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize(&this->m_value,(long)iVar1);
  return;
}

Assistant:

ValueStorage<Stride>::ValueStorage (const VariableType& type)
{
	setStorage(type);
}